

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testMajorAxis<Imath_2_5::Vec2<short>>(char *type)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  short *psVar7;
  char *in_RDI;
  Box<Imath_2_5::Vec2<short>_> b_2;
  Vec2<short> max;
  uint j_1;
  uint i_1;
  uint j;
  Vec2<short> size;
  uint major;
  Box<Imath_2_5::Vec2<short>_> b_1;
  uint i;
  vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> perms;
  Box<Imath_2_5::Vec2<short>_> b;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  Vec2<short> local_6c [3];
  Vec2<short> in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint i_00;
  uint local_58;
  uint local_54;
  Vec2<short> local_50;
  Vec2<short> local_4c;
  uint local_48;
  Vec2<short> local_44 [3];
  uint local_38;
  vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> local_28;
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    majorAxis() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
            ((Box<Imath_2_5::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  uVar1 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::majorAxis
                    ((Box<Imath_2_5::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (uVar1 != 0) {
    __assert_fail("b.majorAxis() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x394,
                  "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<short>]"
                 );
  }
  std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::vector
            ((vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *)0x125013);
  permutations<Imath_2_5::Vec2<short>>
            ((vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_38 = 0;
  while( true ) {
    uVar5 = (ulong)local_38;
    sVar6 = std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::size
                      (&local_28);
    if (sVar6 <= uVar5) {
      std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::~vector
                ((vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_58 = 0;
      do {
        uVar1 = local_58;
        uVar2 = Imath_2_5::Vec2<short>::dimensions();
        if (uVar2 <= uVar1) {
          return;
        }
        uVar2 = 0;
        while( true ) {
          i_00 = uVar2;
          uVar3 = Imath_2_5::Vec2<short>::dimensions();
          if (uVar3 <= uVar2) break;
          Imath_2_5::Vec2<short>::Vec2((Vec2<short> *)&stack0xffffffffffffffa0,0);
          psVar7 = Imath_2_5::Vec2<short>::operator[]((Vec2<short> *)&stack0xffffffffffffffa0,i_00);
          *psVar7 = 1;
          Imath_2_5::Vec2<short>::Vec2(local_6c,0);
          Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
                    ((Box<Imath_2_5::Vec2<short>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff6c,uVar1),
                     (Vec2<short> *)CONCAT44(uVar2,in_stack_ffffffffffffff60));
          uVar2 = Imath_2_5::Box<Imath_2_5::Vec2<short>_>::majorAxis
                            ((Box<Imath_2_5::Vec2<short>_> *)
                             CONCAT44(uVar2,in_stack_ffffffffffffff60));
          if (uVar2 != i_00) {
            __assert_fail("b.majorAxis() == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                          ,0x3c2,
                          "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<short>]"
                         );
          }
          uVar2 = i_00 + 1;
        }
        local_58 = local_58 + 1;
      } while( true );
    }
    Imath_2_5::Vec2<short>::Vec2(local_44,0);
    std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::operator[]
              (&local_28,(ulong)local_38);
    Imath_2_5::Box<Imath_2_5::Vec2<short>_>::Box
              ((Box<Imath_2_5::Vec2<short>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_48 = 0;
    std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::operator[]
              (&local_28,(ulong)local_38);
    Imath_2_5::Vec2<short>::Vec2(&local_50,0);
    Imath_2_5::Vec2<short>::operator-
              ((Vec2<short> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (Vec2<short> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_54 = 1;
    while( true ) {
      in_stack_ffffffffffffff74 = local_54;
      uVar1 = Imath_2_5::Vec2<short>::dimensions();
      if (uVar1 <= in_stack_ffffffffffffff74) break;
      psVar7 = Imath_2_5::Vec2<short>::operator[](&local_4c,local_54);
      in_stack_ffffffffffffff70 = (int)*psVar7;
      psVar7 = Imath_2_5::Vec2<short>::operator[](&local_4c,local_48);
      if (*psVar7 < in_stack_ffffffffffffff70) {
        local_48 = local_54;
      }
      local_54 = local_54 + 1;
    }
    in_stack_ffffffffffffff6c =
         Imath_2_5::Box<Imath_2_5::Vec2<short>_>::majorAxis
                   ((Box<Imath_2_5::Vec2<short>_> *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (in_stack_ffffffffffffff6c != local_48) break;
    local_38 = local_38 + 1;
  }
  __assert_fail("b.majorAxis() == major",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                ,0x3a9,
                "void (anonymous namespace)::testMajorAxis(const char *) [T = Imath_2_5::Vec2<short>]"
               );
}

Assistant:

void
testMajorAxis(const char *type)
{
    cout << "    majorAxis() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(b.majorAxis() == 0);
    }

    //
    // Non-empty, has-volume box.
    // Boxes are [ (0, 0, ...), (<all permutations of 1..T::dimensions()>) ]
    //
    {
        std::vector<T> perms;
        permutations(perms);

        for (unsigned int i = 0; i < perms.size(); i++)
        {
            IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), perms[i]);

            unsigned int major = 0;
            T size = perms[i] - T(0);
            for (unsigned int j = 1; j < T::dimensions(); j++)
                if (size[j] > size[major])
                    major = j;
                    
            assert(b.majorAxis() == major);
        }
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0), (1, 0) ]
    //    2D: [(0, 0), (0, 1) ]
    //
    //    3D: [(0, 0), (1, 0, 0) ]
    //    3D: [(0, 0), (0, 1, 0) ]
    //    3D: [(0, 0), (0, 0, 1) ]
    //
    //    and similarly for 4D
    //
    {
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            for (unsigned int j = 0; j < T::dimensions(); j++)
            {
                T max(0);
                max[j] = 1;

                IMATH_INTERNAL_NAMESPACE::Box<T> b(T(0), max);
                assert(b.majorAxis() == j);
            }
        }
    }
}